

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O0

void __thiscall
Fl_Paged_Device::print_window_part
          (Fl_Paged_Device *this,Fl_Window *win,int x,int y,int w,int h,int delta_x,int delta_y)

{
  Fl_Surface_Device *pFVar1;
  Fl_Display_Device *pFVar2;
  Fl_Window *pFVar3;
  uchar *buf;
  uchar *image_data;
  Fl_Window *save_front;
  Fl_Surface_Device *current;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Window *win_local;
  Fl_Paged_Device *this_local;
  
  pFVar1 = Fl_Surface_Device::surface();
  pFVar2 = Fl_Display_Device::display_device();
  (*(pFVar2->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  pFVar3 = Fl::first_window();
  (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  fl_gc = (GC)0x0;
  Fl::check();
  Fl_Window::make_current(win);
  buf = fl_read_image((uchar *)0x0,x,y,w,h,0);
  if (pFVar3 != win) {
    (*(pFVar3->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  }
  (*(pFVar1->super_Fl_Device)._vptr_Fl_Device[3])();
  fl_draw_image(buf,delta_x,delta_y,w,h,3,0);
  if (buf != (uchar *)0x0) {
    operator_delete__(buf);
  }
  return;
}

Assistant:

void Fl_Paged_Device::print_window_part(Fl_Window *win, int x, int y, int w, int h, int delta_x, int delta_y)
{
  Fl_Surface_Device *current = Fl_Surface_Device::surface();
  Fl_Display_Device::display_device()->set_current();
  Fl_Window *save_front = Fl::first_window();
  win->show();
  fl_gc = NULL;
  Fl::check();
  win->make_current();
  uchar *image_data;
  image_data = fl_read_image(NULL, x, y, w, h);
#ifdef __APPLE__
  Fl_X::q_release_context(); // matches make_current() call above
#endif
  if (save_front != win) save_front->show();
  current->set_current();
  fl_draw_image(image_data, delta_x, delta_y, w, h, 3);
  delete[] image_data;
#ifdef WIN32
  fl_gc = GetDC(fl_xid(win));
  ReleaseDC(fl_xid(win), fl_gc);
#endif
}